

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O0

RK_S32 exp_golomb_signed(RK_S32 val)

{
  undefined4 local_10;
  undefined4 local_c;
  RK_S32 tmp;
  RK_S32 val_local;
  
  local_10 = 0;
  if (val < 1) {
    local_c = val * -2 + 1;
  }
  else {
    local_c = val << 1;
  }
  do {
    local_10 = local_10 + 1;
  } while (local_c >> ((byte)local_10 & 0x1f) != 0);
  return local_10 * 2 + -1;
}

Assistant:

RK_S32 exp_golomb_signed(RK_S32 val)
{
    RK_S32 tmp = 0;

    if (val > 0)
        val = 2 * val;
    else
        val = -2 * val + 1;

    while (val >> ++tmp)
        ;

    return tmp * 2 - 1;
}